

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O2

vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL> *
__thiscall
estl::
vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>::
operator=(vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
          *this,vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
                *other)

{
  long lVar1;
  size_type sVar2;
  bool bVar3;
  
  if (this != other) {
    sVar2 = other->size_;
    lVar1 = sVar2 << 5;
    while( true ) {
      bVar3 = sVar2 == 0;
      sVar2 = sVar2 - 1;
      if (bVar3) break;
      std::__cxx11::string::string
                ((string *)((long)&this->data_ptr_[-1]._M_dataplus._M_p + lVar1),
                 (string *)((long)&other->data_ptr_[-1]._M_dataplus._M_p + lVar1));
      lVar1 = lVar1 + -0x20;
    }
    this->size_ = other->size_;
  }
  return this;
}

Assistant:

vector_s& operator=(const vector_s& other)
    {
        // NOTE: The reinterpret cast is needed as the pointer types can potentially
        //       be different if the capacities of the vectors are different.
        //       As we merely need to check the pointer adresses it's ok with
        //       with this "crude" cast here!
        if (reinterpret_cast<void*>(this) != reinterpret_cast<const void*>(&other)) // prevent self-assignment
        {
            for (size_type i = other.size(); i > 0; ) {
                --i;
                const pointer insert_ptr = data_ptr_ + i;
                new (insert_ptr) value_type(other[i]);
            }
            size_ = other.size();
        }
        return *this;
    }